

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
* __thiscall
nlohmann::
json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::get_checked(json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this,basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    *ptr)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_type __val;
  ulong uVar4;
  char *pcVar5;
  parse_error *__return_storage_ptr__;
  out_of_range *poVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [3];
  invalid_argument *anon_var_0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a5;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  reference local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *reference_token;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  *ptr_local;
  json_pointer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->reference_tokens);
  reference_token =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(&this->reference_tokens);
  __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)ptr;
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&reference_token);
    if (!bVar2) {
      return (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              *)__range2;
    }
    local_38 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
    cVar1 = *(char *)&(__range2->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
    if (cVar1 == '\x01') {
      __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)__range2,local_38);
    }
    else {
      if (cVar1 != '\x02') {
        poVar6 = (out_of_range *)__cxa_allocate_exception(0x20);
        std::operator+(&local_180,"unresolved reference token \'",local_38);
        std::operator+(local_160,&local_180,"\'");
        detail::out_of_range::create(poVar6,0x194,local_160);
        __cxa_throw(poVar6,&detail::out_of_range::typeinfo,detail::out_of_range::~out_of_range);
      }
      bVar2 = std::operator==(local_38,"-");
      if (bVar2) {
        local_a5 = 1;
        poVar6 = (out_of_range *)__cxa_allocate_exception(0x20);
        __val = std::
                vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                ::size((vector<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                        *)(__range2->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::to_string(&local_98,__val);
        std::operator+(&local_78,"array index \'-\' (",&local_98);
        std::operator+(&local_58,&local_78,") is out of range");
        detail::out_of_range::create(poVar6,0x192,&local_58);
        local_a5 = 0;
        __cxa_throw(poVar6,&detail::out_of_range::typeinfo,detail::out_of_range::~out_of_range);
      }
      uVar4 = std::__cxx11::string::size();
      bVar2 = false;
      if (1 < uVar4) {
        pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)local_38);
        bVar2 = *pcVar5 == '0';
      }
      if (bVar2) {
        anon_var_0._7_1_ = 1;
        __return_storage_ptr__ = (parse_error *)__cxa_allocate_exception(0x28);
        std::operator+(&local_e8,"array index \'",local_38);
        std::operator+(&local_c8,&local_e8,"\' must not begin with \'0\'");
        detail::parse_error::create(__return_storage_ptr__,0x6a,0,&local_c8);
        anon_var_0._7_1_ = 0;
        __cxa_throw(__return_storage_ptr__,&detail::parse_error::typeinfo,
                    detail::parse_error::~parse_error);
      }
      iVar3 = array_index(local_38);
      __range2 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                          *)__range2,(long)iVar3);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  } while( true );
}

Assistant:

const BasicJsonType& get_checked(const BasicJsonType* ptr) const {
		using size_type = typename BasicJsonType::size_type;
		for (const auto& reference_token : reference_tokens) {
			switch (ptr->m_type) {
				case detail::value_t::object: {
					// note: at performs range check
					ptr = &ptr->at(reference_token);
					break;
				}

				case detail::value_t::array: {
					if (JSON_UNLIKELY(reference_token == "-")) {
						// "-" always fails the range check
						JSON_THROW(detail::out_of_range::create(
							402,
							"array index '-' (" + std::to_string(ptr->m_value.array->size()) + ") is out of range"));
					}

					// error condition (cf. RFC 6901, Sect. 4)
					if (JSON_UNLIKELY(reference_token.size() > 1 and reference_token[0] == '0')) {
						JSON_THROW(detail::parse_error::create(
							106, 0, "array index '" + reference_token + "' must not begin with '0'"));
					}

					// note: at performs range check
					JSON_TRY { ptr = &ptr->at(static_cast<size_type>(array_index(reference_token))); }
					JSON_CATCH(std::invalid_argument&) {
						JSON_THROW(detail::parse_error::create(
							109, 0, "array index '" + reference_token + "' is not a number"));
					}
					break;
				}

				default:
					JSON_THROW(
						detail::out_of_range::create(404, "unresolved reference token '" + reference_token + "'"));
			}